

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_deviate_units(ly_ctx *ctx,lys_deviate *deviate,lys_node *dev_target)

{
  int iVar1;
  lys_node *plVar2;
  char *pcVar3;
  
  if ((dev_target->nodetype == LYS_LEAF) || (dev_target->nodetype == LYS_LEAFLIST)) {
    plVar2 = dev_target[1].next;
    if (deviate->mod == LY_DEVIATE_ADD) {
      if (plVar2 == (lys_node *)0x0) {
LAB_001565e0:
        lydict_remove(ctx,(char *)dev_target[1].next);
        plVar2 = (lys_node *)lydict_insert(ctx,deviate->units,0);
        dev_target[1].next = plVar2;
        return 0;
      }
      ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
      pcVar3 = "Adding property that already exists.";
    }
    else if (deviate->mod == LY_DEVIATE_DEL) {
      if (plVar2 == (lys_node *)deviate->units) {
        lydict_remove(ctx,(char *)plVar2);
        dev_target[1].next = (lys_node *)0x0;
        iVar1 = lys_ext_iter(dev_target->ext,dev_target->ext_size,'\0',LYEXT_SUBSTMT_UNITS);
        if (iVar1 == -1) {
          return 0;
        }
        do {
          lyp_ext_instance_rm(ctx,&dev_target->ext,&dev_target->ext_size,(uint8_t)iVar1);
          iVar1 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(uint8_t)iVar1,
                               LYEXT_SUBSTMT_UNITS);
        } while (iVar1 != -1);
        return 0;
      }
      ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,(lys_node *)deviate->units,"units");
      pcVar3 = "Value differs from the target being deleted.";
    }
    else {
      if (plVar2 != (lys_node *)0x0) goto LAB_001565e0;
      ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
      pcVar3 = "Replacing a property that does not exist.";
    }
  }
  else {
    ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
    pcVar3 = "Target node does not allow \"units\" property.";
  }
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar3);
  return 1;
}

Assistant:

int
yang_read_deviate_units(struct ly_ctx *ctx, struct lys_deviate *deviate, struct lys_node *dev_target)
{
    const char **stritem;
    int j;

    /* check target node type */
    if (dev_target->nodetype == LYS_LEAFLIST) {
        stritem = &((struct lys_node_leaflist *)dev_target)->units;
    } else if (dev_target->nodetype == LYS_LEAF) {
        stritem = &((struct lys_node_leaf *)dev_target)->units;
    } else {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"units\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_DEL) {
        /* check values */
        if (!ly_strequal(*stritem, deviate->units, 1)) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, deviate->units, "units");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
            goto error;
        }
        /* remove current units value of the target */
        lydict_remove(ctx, *stritem);
        *stritem = NULL;
        /* remove its extensions */
        j = -1;
        while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_UNITS)) != -1) {
            lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
            --j;
        }
    } else {
        if (deviate->mod == LY_DEVIATE_ADD) {
            /* check that there is no current value */
            if (*stritem) {
                LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
                goto error;
            }
        } else { /* replace */
            if (!*stritem) {
                LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
                goto error;
            }
        }
        /* remove current units value of the target ... */
        lydict_remove(ctx, *stritem);

        /* ... and replace it with the value specified in deviation */
        *stritem = lydict_insert(ctx, deviate->units, 0);
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}